

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O3

bool google::SendEmailInternal(char *dest,char *subject,char *body,bool use_logging)

{
  LogMessageData *pLVar1;
  bool bVar2;
  int iVar3;
  size_t sVar4;
  long *plVar5;
  FILE *__s;
  uint *puVar6;
  LogMessageData *pLVar7;
  int err;
  int err_00;
  ulong uVar8;
  undefined1 *puVar9;
  undefined8 uVar10;
  LogStream *pLVar11;
  byte bVar12;
  string cmd;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  allocator<char> local_131;
  undefined1 local_130 [32];
  LogMessage local_110;
  undefined1 local_100 [16];
  LogMessage local_f0;
  undefined1 local_e0 [24];
  long local_c8;
  ulong local_c0 [2];
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  if ((dest != (char *)0x0) && (*dest != '\0')) {
    if (use_logging) {
      if (0 < *SendEmailInternal::vlocal__) {
        if (SendEmailInternal::vlocal__ == &kLogSiteUninitialized) {
          bVar2 = InitVLOG3__(&SendEmailInternal::vlocal__,&fLI::FLAGS_v,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging.cc"
                              ,1);
          if (!bVar2) goto LAB_00113542;
        }
        LogMessage::LogMessage
                  (&local_110,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging.cc"
                   ,0x722);
        pLVar11 = &(local_110.data_)->stream_;
        std::__ostream_insert<char,std::char_traits<char>>
                  (&pLVar11->super_ostream,"Trying to send TITLE:",0x15);
        if (subject == (char *)0x0) {
          std::ios::clear((int)pLVar11 + (int)(pLVar11->super_ostream)._vptr_basic_ostream[-3]);
        }
        else {
          sVar4 = strlen(subject);
          std::__ostream_insert<char,std::char_traits<char>>(&pLVar11->super_ostream,subject,sVar4);
        }
        std::__ostream_insert<char,std::char_traits<char>>(&pLVar11->super_ostream," BODY:",6);
        if (body == (char *)0x0) {
          std::ios::clear((int)pLVar11 + (int)(pLVar11->super_ostream)._vptr_basic_ostream[-3]);
        }
        else {
          sVar4 = strlen(body);
          std::__ostream_insert<char,std::char_traits<char>>(&pLVar11->super_ostream,body,sVar4);
        }
        std::__ostream_insert<char,std::char_traits<char>>(&pLVar11->super_ostream," to ",4);
        sVar4 = strlen(dest);
        std::__ostream_insert<char,std::char_traits<char>>(&pLVar11->super_ostream,dest,sVar4);
        LogMessage::~LogMessage(&local_110);
      }
    }
    else {
      fprintf(_stderr,"Trying to send TITLE: %s BODY: %s to %s\n",subject,body,dest);
    }
LAB_00113542:
    local_e0._16_8_ = local_c0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(local_e0 + 0x10),*fLS::FLAGS_logmailer_abi_cxx11_,
               fLS::FLAGS_logmailer_abi_cxx11_[1] + *fLS::FLAGS_logmailer_abi_cxx11_);
    std::__cxx11::string::append((char *)(local_e0 + 0x10));
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,subject,&local_131);
    ShellEscape(&local_90,&local_50);
    uVar8 = 0xf;
    if ((ulong *)local_e0._16_8_ != local_c0) {
      uVar8 = local_c0[0];
    }
    if (uVar8 < local_90._M_string_length + local_c8) {
      uVar10 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        uVar10 = local_90.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar10 < local_90._M_string_length + local_c8) goto LAB_001135f6;
      plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,local_e0._16_8_)
      ;
    }
    else {
LAB_001135f6:
      plVar5 = (long *)std::__cxx11::string::_M_append
                                 (local_e0 + 0x10,(ulong)local_90._M_dataplus._M_p);
    }
    local_f0.allocated_ = (LogMessageData *)local_e0;
    pLVar1 = (LogMessageData *)(plVar5 + 2);
    if ((LogMessageData *)*plVar5 == pLVar1) {
      local_e0._0_4_ = pLVar1->preserved_errno_;
      local_e0[4] = pLVar1->message_text_[0];
      local_e0[5] = pLVar1->message_text_[1];
      local_e0[6] = pLVar1->message_text_[2];
      local_e0[7] = pLVar1->message_text_[3];
      local_e0._8_8_ = plVar5[3];
    }
    else {
      local_e0._0_4_ = pLVar1->preserved_errno_;
      local_e0[4] = pLVar1->message_text_[0];
      local_e0[5] = pLVar1->message_text_[1];
      local_e0[6] = pLVar1->message_text_[2];
      local_e0[7] = pLVar1->message_text_[3];
      local_f0.allocated_ = (LogMessageData *)*plVar5;
    }
    local_f0.data_ = (LogMessageData *)plVar5[1];
    *plVar5 = (long)pLVar1;
    plVar5[1] = 0;
    *(undefined1 *)&pLVar1->preserved_errno_ = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_f0);
    pLVar1 = (LogMessageData *)(local_130 + 0x10);
    pLVar7 = (LogMessageData *)(plVar5 + 2);
    if ((LogMessageData *)*plVar5 == pLVar7) {
      local_130._16_8_ = *(undefined8 *)pLVar7;
      local_130._24_8_ = plVar5[3];
      local_130._0_8_ = pLVar1;
    }
    else {
      local_130._16_8_ = *(undefined8 *)pLVar7;
      local_130._0_8_ = (LogMessageData *)*plVar5;
    }
    local_130._8_8_ = plVar5[1];
    *plVar5 = (long)pLVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    sVar4 = strlen(dest);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,dest,dest + sVar4);
    ShellEscape(&local_b0,&local_70);
    puVar9 = (undefined1 *)0xf;
    if ((LogMessageData *)local_130._0_8_ != pLVar1) {
      puVar9 = (undefined1 *)local_130._16_8_;
    }
    if (puVar9 < (char *)(local_130._8_8_ + 4) + (local_b0._M_string_length - 4)) {
      uVar10 = (undefined1 *)0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        uVar10 = local_b0.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar10 < (char *)(local_130._8_8_ + 4) + (local_b0._M_string_length - 4))
      goto LAB_00113741;
      plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_b0,0,(char *)0x0,local_130._0_8_)
      ;
    }
    else {
LAB_00113741:
      plVar5 = (long *)std::__cxx11::string::_M_append(local_130,(ulong)local_b0._M_dataplus._M_p);
    }
    local_110.allocated_ = (LogMessageData *)local_100;
    pLVar7 = (LogMessageData *)(plVar5 + 2);
    if ((LogMessageData *)*plVar5 == pLVar7) {
      local_100._0_4_ = pLVar7->preserved_errno_;
      local_100[4] = pLVar7->message_text_[0];
      local_100[5] = pLVar7->message_text_[1];
      local_100[6] = pLVar7->message_text_[2];
      local_100[7] = pLVar7->message_text_[3];
      local_100._8_8_ = plVar5[3];
    }
    else {
      local_100._0_4_ = pLVar7->preserved_errno_;
      local_100[4] = pLVar7->message_text_[0];
      local_100[5] = pLVar7->message_text_[1];
      local_100[6] = pLVar7->message_text_[2];
      local_100[7] = pLVar7->message_text_[3];
      local_110.allocated_ = (LogMessageData *)*plVar5;
    }
    local_110.data_ = (LogMessageData *)plVar5[1];
    *plVar5 = (long)pLVar7;
    plVar5[1] = 0;
    *(undefined1 *)&pLVar7->preserved_errno_ = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    if ((LogMessageData *)local_130._0_8_ != pLVar1) {
      operator_delete((void *)local_130._0_8_,(ulong)(local_130._16_8_ + 1));
    }
    if (local_f0.allocated_ != (LogMessageData *)local_e0) {
      operator_delete(local_f0.allocated_,local_e0._0_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if ((ulong *)local_e0._16_8_ != local_c0) {
      operator_delete((void *)local_e0._16_8_,local_c0[0] + 1);
    }
    if (3 < *SendEmailInternal(char_const*,char_const*,char_const*,bool)::vlocal__) {
      if (SendEmailInternal(char_const*,char_const*,char_const*,bool)::vlocal__ ==
          &kLogSiteUninitialized) {
        bVar2 = InitVLOG3__(&SendEmailInternal(char_const*,char_const*,char_const*,bool)::vlocal__,
                            &fLI::FLAGS_v,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging.cc"
                            ,4);
        if (!bVar2) goto LAB_001138f7;
      }
      LogMessage::LogMessage
                ((LogMessage *)local_130,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging.cc"
                 ,0x72c);
      pLVar11 = (LogStream *)(local_130._8_8_ + 0x7538);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)pLVar11,"Mailing command: ",0x11);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)pLVar11,(char *)local_110.allocated_,(long)local_110.data_);
      LogMessage::~LogMessage((LogMessage *)local_130);
    }
LAB_001138f7:
    __s = popen((char *)local_110.allocated_,"w");
    if (__s == (FILE *)0x0) {
      if (use_logging) {
        LogMessage::LogMessage
                  ((LogMessage *)local_130,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging.cc"
                   ,0x740,2);
        body = (char *)(local_130._8_8_ + 0x7538);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)body,"Unable to send mail to ",0x17);
        sVar4 = strlen(dest);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)body,dest,sVar4);
        LogMessage::~LogMessage((LogMessage *)local_130);
      }
      else {
        fprintf(_stderr,"Unable to send mail to %s\n",dest);
      }
    }
    else {
      if (body != (char *)0x0) {
        sVar4 = strlen(body);
        fwrite(body,1,sVar4,__s);
      }
      iVar3 = pclose(__s);
      body = (char *)0x1;
      if (iVar3 == -1) {
        if (use_logging) {
          LogMessage::LogMessage
                    (&local_f0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging.cc"
                     ,0x736,2);
          pLVar11 = &(local_f0.data_)->stream_;
          std::__ostream_insert<char,std::char_traits<char>>
                    (&pLVar11->super_ostream,"Problems sending mail to ",0x19);
          sVar4 = strlen(dest);
          std::__ostream_insert<char,std::char_traits<char>>(&pLVar11->super_ostream,dest,sVar4);
          std::__ostream_insert<char,std::char_traits<char>>(&pLVar11->super_ostream,": ",2);
          puVar6 = (uint *)__errno_location();
          StrError_abi_cxx11_((string *)local_130,(google *)(ulong)*puVar6,err);
          std::__ostream_insert<char,std::char_traits<char>>
                    (&pLVar11->super_ostream,(char *)local_130._0_8_,local_130._8_8_);
          if ((LogMessageData *)local_130._0_8_ != pLVar1) {
            operator_delete((void *)local_130._0_8_,(ulong)(local_130._16_8_ + 1));
          }
          LogMessage::~LogMessage(&local_f0);
        }
        else {
          puVar6 = (uint *)__errno_location();
          StrError_abi_cxx11_((string *)local_130,(google *)(ulong)*puVar6,err_00);
          SendEmailInternal();
        }
        body = (char *)0x0;
      }
    }
    bVar12 = (byte)body;
    if (local_110.allocated_ != (LogMessageData *)local_100) {
      operator_delete(local_110.allocated_,local_100._0_8_ + 1);
    }
    if (__s != (FILE *)0x0) goto LAB_00113a84;
  }
  bVar12 = 0;
LAB_00113a84:
  return (bool)(bVar12 & 1);
}

Assistant:

static bool SendEmailInternal(const char*dest, const char *subject,
                              const char*body, bool use_logging) {
  if (dest && *dest) {
    if ( use_logging ) {
      VLOG(1) << "Trying to send TITLE:" << subject
              << " BODY:" << body << " to " << dest;
    } else {
      fprintf(stderr, "Trying to send TITLE: %s BODY: %s to %s\n",
              subject, body, dest);
    }

    string cmd =
        FLAGS_logmailer + " -s" +
        ShellEscape(subject) + " " + ShellEscape(dest);
    VLOG(4) << "Mailing command: " << cmd;

    FILE* pipe = popen(cmd.c_str(), "w");
    if (pipe != NULL) {
      // Add the body if we have one
      if (body)
        fwrite(body, sizeof(char), strlen(body), pipe);
      bool ok = pclose(pipe) != -1;
      if ( !ok ) {
        if ( use_logging ) {
          LOG(ERROR) << "Problems sending mail to " << dest << ": "
                     << StrError(errno);
        } else {
          fprintf(stderr, "Problems sending mail to %s: %s\n",
                  dest, StrError(errno).c_str());
        }
      }
      return ok;
    } else {
      if ( use_logging ) {
        LOG(ERROR) << "Unable to send mail to " << dest;
      } else {
        fprintf(stderr, "Unable to send mail to %s\n", dest);
      }
    }
  }
  return false;
}